

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_fetch_input(mbedtls_ssl_context *ssl,size_t nb_want)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  mbedtls_ssl_context *pmVar6;
  int line;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x8a0,"=> fetch input");
  if ((ssl->f_recv == (mbedtls_ssl_recv_t *)0x0) &&
     (ssl->f_recv_timeout == (mbedtls_ssl_recv_timeout_t *)0x0)) {
    pcVar9 = "Bad usage of mbedtls_ssl_set_bio() or mbedtls_ssl_set_bio()";
    iVar3 = 0x8a5;
LAB_00117a2b:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar3,pcVar9);
    return -0x7100;
  }
  if (ssl->in_buf + (0x414d - (long)ssl->in_hdr) < nb_want) {
    pcVar9 = "requesting more data than fits";
    iVar3 = 0x8ab;
    goto LAB_00117a2b;
  }
  if ((ssl->conf->field_0x174 & 2) == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x93e,"in_left: %d, nb_want: %d",ssl->in_left,nb_want);
    uVar10 = ssl->in_left;
    while (uVar10 < nb_want) {
      iVar3 = ssl_check_timer(ssl);
      uVar8 = 0xffff9800;
      if (iVar3 == 0) {
        if (ssl->f_recv_timeout == (mbedtls_ssl_recv_timeout_t *)0x0) {
          uVar4 = (*ssl->f_recv)(ssl->p_bio,ssl->in_hdr + ssl->in_left,nb_want - uVar10);
        }
        else {
          uVar4 = (*ssl->f_recv_timeout)
                            (ssl->p_bio,ssl->in_hdr + ssl->in_left,nb_want - uVar10,
                             ssl->conf->read_timeout);
        }
        uVar8 = (ulong)uVar4;
      }
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x956,"in_left: %d, nb_want: %d",ssl->in_left,nb_want);
      iVar3 = (int)uVar8;
      mbedtls_debug_print_ret
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x957,"ssl->f_recv(_timeout)",iVar3);
      if (iVar3 == 0) {
        return -0x7280;
      }
      if (iVar3 < 0) {
        return iVar3;
      }
      uVar10 = uVar8 + ssl->in_left;
      ssl->in_left = uVar10;
    }
  }
  else {
    if ((ssl->f_set_timer == (mbedtls_ssl_set_timer_t *)0x0) ||
       (ssl->f_get_timer == (mbedtls_ssl_get_timer_t *)0x0)) {
      pcVar9 = "You must use mbedtls_ssl_set_timer_cb() for DTLS";
      iVar3 = 0x8b8;
      goto LAB_00117a2b;
    }
    uVar10 = ssl->next_record_offset;
    if (uVar10 != 0) {
      sVar5 = ssl->in_left - uVar10;
      if (ssl->in_left < uVar10) {
        iVar3 = 0x8ca;
        goto LAB_00117af6;
      }
      ssl->in_left = sVar5;
      if (sVar5 != 0) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x8d3,"next record in same datagram, offset: %d");
        memmove(ssl->in_hdr,ssl->in_hdr + ssl->next_record_offset,ssl->in_left);
      }
      ssl->next_record_offset = 0;
    }
    sVar5 = nb_want;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x8dd,"in_left: %d, nb_want: %d",ssl->in_left,nb_want);
    if (nb_want <= ssl->in_left) {
      iVar3 = 0x8e4;
      goto LAB_00117997;
    }
    if (ssl->in_left != 0) {
      iVar3 = 0x8ef;
LAB_00117af6:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,iVar3,"should never happen");
      return -0x6c00;
    }
    iVar3 = ssl_check_timer(ssl);
    if (iVar3 != 0) {
LAB_00117b37:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x913,"timeout");
      ssl_set_timer(ssl,0);
      if (ssl->state == 0x10) {
        if ((ssl->conf->field_0x174 & 1) == 0) {
          return -0x6800;
        }
        if (ssl->renego_status != 3) {
          return -0x6800;
        }
        iVar3 = ssl_resend_hello_request(ssl);
        if (iVar3 == 0) {
          return -0x6900;
        }
        pcVar9 = "ssl_resend_hello_request";
        line = 0x92c;
      }
      else {
        iVar3 = ssl_double_retransmit_timeout(ssl);
        if (iVar3 != 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x91a,"handshake timeout");
          return -0x6800;
        }
        iVar3 = mbedtls_ssl_resend(ssl);
        if (iVar3 == 0) {
          return -0x6900;
        }
        pcVar9 = "mbedtls_ssl_resend";
        line = 0x920;
      }
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,line,pcVar9,iVar3);
      return iVar3;
    }
    puVar1 = ssl->in_buf;
    puVar2 = ssl->in_hdr;
    bVar11 = ssl->state == 0x10;
    pmVar6 = (mbedtls_ssl_context *)&ssl->handshake;
    if (bVar11) {
      pmVar6 = ssl;
    }
    lVar7 = 0x3c8;
    if (bVar11) {
      lVar7 = 0x150;
    }
    uVar4 = *(uint *)((long)pmVar6->conf->ciphersuite_list + lVar7);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x903,"f_recv_timeout: %u ms",(ulong)uVar4,sVar5);
    if (ssl->f_recv_timeout == (mbedtls_ssl_recv_timeout_t *)0x0) {
      uVar4 = (*ssl->f_recv)(ssl->p_bio,ssl->in_hdr,(size_t)(puVar1 + (0x414d - (long)puVar2)));
    }
    else {
      uVar4 = (*ssl->f_recv_timeout)
                        (ssl->p_bio,ssl->in_hdr,(size_t)(puVar1 + (0x414d - (long)puVar2)),uVar4);
    }
    mbedtls_debug_print_ret
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x90b,"ssl->f_recv(_timeout)",uVar4);
    if (uVar4 == 0) {
      return -0x7280;
    }
    if (uVar4 == 0xffff9800) goto LAB_00117b37;
    if ((int)uVar4 < 0) {
      return uVar4;
    }
    ssl->in_left = (ulong)uVar4;
  }
  iVar3 = 0x963;
LAB_00117997:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,iVar3,"<= fetch input");
  return 0;
}

Assistant:

int mbedtls_ssl_fetch_input( mbedtls_ssl_context *ssl, size_t nb_want )
{
    int ret;
    size_t len;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> fetch input" ) );

    if( ssl->f_recv == NULL && ssl->f_recv_timeout == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "Bad usage of mbedtls_ssl_set_bio() "
                            "or mbedtls_ssl_set_bio()" ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    if( nb_want > MBEDTLS_SSL_BUFFER_LEN - (size_t)( ssl->in_hdr - ssl->in_buf ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "requesting more data than fits" ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        uint32_t timeout;

        /* Just to be sure */
        if( ssl->f_set_timer == NULL || ssl->f_get_timer == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "You must use "
                        "mbedtls_ssl_set_timer_cb() for DTLS" ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
        }

        /*
         * The point is, we need to always read a full datagram at once, so we
         * sometimes read more then requested, and handle the additional data.
         * It could be the rest of the current record (while fetching the
         * header) and/or some other records in the same datagram.
         */

        /*
         * Move to the next record in the already read datagram if applicable
         */
        if( ssl->next_record_offset != 0 )
        {
            if( ssl->in_left < ssl->next_record_offset )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }

            ssl->in_left -= ssl->next_record_offset;

            if( ssl->in_left != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "next record in same datagram, offset: %d",
                                    ssl->next_record_offset ) );
                memmove( ssl->in_hdr,
                         ssl->in_hdr + ssl->next_record_offset,
                         ssl->in_left );
            }

            ssl->next_record_offset = 0;
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "in_left: %d, nb_want: %d",
                       ssl->in_left, nb_want ) );

        /*
         * Done if we already have enough data.
         */
        if( nb_want <= ssl->in_left)
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= fetch input" ) );
            return( 0 );
        }

        /*
         * A record can't be split accross datagrams. If we need to read but
         * are not at the beginning of a new record, the caller did something
         * wrong.
         */
        if( ssl->in_left != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        /*
         * Don't even try to read if time's out already.
         * This avoids by-passing the timer when repeatedly receiving messages
         * that will end up being dropped.
         */
        if( ssl_check_timer( ssl ) != 0 )
            ret = MBEDTLS_ERR_SSL_TIMEOUT;
        else
        {
            len = MBEDTLS_SSL_BUFFER_LEN - ( ssl->in_hdr - ssl->in_buf );

            if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
                timeout = ssl->handshake->retransmit_timeout;
            else
                timeout = ssl->conf->read_timeout;

            MBEDTLS_SSL_DEBUG_MSG( 3, ( "f_recv_timeout: %u ms", timeout ) );

            if( ssl->f_recv_timeout != NULL )
                ret = ssl->f_recv_timeout( ssl->p_bio, ssl->in_hdr, len,
                                                                    timeout );
            else
                ret = ssl->f_recv( ssl->p_bio, ssl->in_hdr, len );

            MBEDTLS_SSL_DEBUG_RET( 2, "ssl->f_recv(_timeout)", ret );

            if( ret == 0 )
                return( MBEDTLS_ERR_SSL_CONN_EOF );
        }

        if( ret == MBEDTLS_ERR_SSL_TIMEOUT )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "timeout" ) );
            ssl_set_timer( ssl, 0 );

            if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
            {
                if( ssl_double_retransmit_timeout( ssl ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake timeout" ) );
                    return( MBEDTLS_ERR_SSL_TIMEOUT );
                }

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }

                return( MBEDTLS_ERR_SSL_WANT_READ );
            }
#if defined(MBEDTLS_SSL_SRV_C) && defined(MBEDTLS_SSL_RENEGOTIATION)
            else if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
                     ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING )
            {
                if( ( ret = ssl_resend_hello_request( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "ssl_resend_hello_request", ret );
                    return( ret );
                }

                return( MBEDTLS_ERR_SSL_WANT_READ );
            }
#endif /* MBEDTLS_SSL_SRV_C && MBEDTLS_SSL_RENEGOTIATION */
        }

        if( ret < 0 )
            return( ret );

        ssl->in_left = ret;
    }
    else
#endif
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "in_left: %d, nb_want: %d",
                       ssl->in_left, nb_want ) );

        while( ssl->in_left < nb_want )
        {
            len = nb_want - ssl->in_left;

            if( ssl_check_timer( ssl ) != 0 )
                ret = MBEDTLS_ERR_SSL_TIMEOUT;
            else
            {
                if( ssl->f_recv_timeout != NULL )
                {
                    ret = ssl->f_recv_timeout( ssl->p_bio,
                                               ssl->in_hdr + ssl->in_left, len,
                                               ssl->conf->read_timeout );
                }
                else
                {
                    ret = ssl->f_recv( ssl->p_bio,
                                       ssl->in_hdr + ssl->in_left, len );
                }
            }

            MBEDTLS_SSL_DEBUG_MSG( 2, ( "in_left: %d, nb_want: %d",
                                        ssl->in_left, nb_want ) );
            MBEDTLS_SSL_DEBUG_RET( 2, "ssl->f_recv(_timeout)", ret );

            if( ret == 0 )
                return( MBEDTLS_ERR_SSL_CONN_EOF );

            if( ret < 0 )
                return( ret );

            ssl->in_left += ret;
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= fetch input" ) );

    return( 0 );
}